

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O0

void __thiscall HdmiCecAnalyzerResults::GenOpCodeBubble(HdmiCecAnalyzerResults *this,Frame *frame)

{
  OpCode opCode_00;
  char *pcVar1;
  string local_158 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [32];
  string local_d8 [32];
  string local_b8 [39];
  allocator local_91;
  string local_90 [35];
  allocator local_6d [13];
  string local_60 [8];
  string opCodeText;
  undefined1 local_40 [8];
  string opCodeStr;
  OpCode opCode;
  Frame *frame_local;
  HdmiCecAnalyzerResults *this_local;
  
  opCode_00 = *(OpCode *)(frame + 0x10);
  GetNumberString_abi_cxx11_
            ((HdmiCecAnalyzerResults *)local_40,(U64)this,(int)*(undefined8 *)(frame + 0x10));
  pcVar1 = HdmiCec::GetOpCodeString(opCode_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,pcVar1,local_6d);
  std::allocator<char>::~allocator((allocator<char> *)local_6d);
  if ((this->mTabular & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"O",&local_91);
    AddResult(this,(string *)local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    std::operator+((char *)local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Op. ");
    AddResult(this,local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    std::operator+((char *)local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Opcode ");
    AddResult(this,local_d8);
    std::__cxx11::string::~string((string *)local_d8);
  }
  std::operator+((char *)local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Opcode ");
  std::operator+(local_138,(char *)local_158);
  std::operator+(local_118,local_138);
  std::operator+(local_f8,(char *)local_118);
  AddResult(this,local_f8);
  std::__cxx11::string::~string((string *)local_f8);
  std::__cxx11::string::~string((string *)local_118);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenOpCodeBubble( const Frame& frame )
{
    HdmiCec::OpCode opCode = static_cast<HdmiCec::OpCode>( frame.mData1 );
    std::string opCodeStr = GetNumberString( frame.mData1, 8 );
    std::string opCodeText = HdmiCec::GetOpCodeString( opCode );

    if( !mTabular )
    {
        AddResult( "O" );
        AddResult( "Op. " + opCodeStr );
        AddResult( "Opcode " + opCodeStr );
    }
    AddResult( "Opcode " + opCodeStr + " (" + opCodeText + ")" );
}